

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGL3DriverBase::setViewPort(COpenGL3DriverBase *this,rect<int> *area)

{
  COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int viewportX;
  int iVar3;
  int iVar4;
  int iVar5;
  
  viewportX = (area->UpperLeftCorner).X;
  iVar5 = (area->UpperLeftCorner).Y;
  iVar3 = (area->LowerRightCorner).X;
  iVar4 = (area->LowerRightCorner).Y;
  iVar1 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3c])();
  iVar1 = *(int *)CONCAT44(extraout_var,iVar1);
  iVar2 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3c])(this);
  if (iVar1 < iVar3) {
    iVar3 = iVar1;
  }
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 4);
  if (iVar2 < iVar4) {
    iVar4 = iVar2;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  if (iVar1 < viewportX) {
    viewportX = iVar1;
  }
  if (iVar2 < iVar5) {
    iVar5 = iVar2;
  }
  if (viewportX < 1) {
    viewportX = 0;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (iVar4 - iVar5 != 0 && iVar5 <= iVar4) {
    if (iVar3 - viewportX != 0 && viewportX <= iVar3) {
      this_00 = this->CacheHandler;
      iVar1 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3c])(this);
      COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
      ::setViewport(this_00,viewportX,*(int *)(CONCAT44(extraout_var_01,iVar1) + 4) - iVar4,
                    iVar3 - viewportX,iVar4 - iVar5);
    }
  }
  (this->super_CNullDriver).ViewPort.UpperLeftCorner.X = viewportX;
  (this->super_CNullDriver).ViewPort.UpperLeftCorner.Y = iVar5;
  (this->super_CNullDriver).ViewPort.LowerRightCorner.X = iVar3;
  (this->super_CNullDriver).ViewPort.LowerRightCorner.Y = iVar4;
  return;
}

Assistant:

void COpenGL3DriverBase::setViewPort(const core::rect<s32> &area)
{
	core::rect<s32> vp = area;
	core::rect<s32> rendert(0, 0, getCurrentRenderTargetSize().Width, getCurrentRenderTargetSize().Height);
	vp.clipAgainst(rendert);

	if (vp.getHeight() > 0 && vp.getWidth() > 0)
		CacheHandler->setViewport(vp.UpperLeftCorner.X, getCurrentRenderTargetSize().Height - vp.UpperLeftCorner.Y - vp.getHeight(), vp.getWidth(), vp.getHeight());

	ViewPort = vp;
}